

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

bool __thiscall QHstsHeaderParser::parseDirective(QHstsHeaderParser *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray directiveValue;
  QByteArray directiveName;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QByteArray *lhs;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar4;
  QByteArray *in_stack_ffffffffffffffb0;
  QByteArray *name;
  char *this_00;
  QByteArray local_40;
  undefined8 local_28;
  QHstsHeaderParser *in_stack_ffffffffffffffe0;
  QHstsHeaderParser *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDI;
  bVar2 = nextToken(in_stack_ffffffffffffffe0);
  if (!bVar2) {
    bVar4 = 0;
    goto LAB_0017a543;
  }
  qVar3 = QByteArray::size(in_RDI + 1);
  if (qVar3 == 0) {
    bVar4 = 1;
    goto LAB_0017a543;
  }
  bVar2 = ::operator==(lhs,(char **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (bVar2) {
    bVar4 = 1;
    goto LAB_0017a543;
  }
  QByteArray::at((QByteArray *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 0x17a377);
  bVar2 = isTOKEN('\0');
  if (!bVar2) {
    bVar4 = 0;
    goto LAB_0017a543;
  }
  local_28 = 0xaaaaaaaaaaaaaaaa;
  this_01 = (QHstsHeaderParser *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            (in_RDI,(QByteArray *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar2 = nextToken(this_01);
  if (bVar2) {
    local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_40.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_40.d.size = -0x5555555555555556;
    QByteArray::QByteArray((QByteArray *)0x17a412);
    this_00 = ";";
    bVar2 = ::operator==(lhs,(char **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
    ;
    if (bVar2) {
      bVar4 = processDirective((QHstsHeaderParser *)this_00,in_stack_ffffffffffffffb0,
                               (QByteArray *)
                               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
    else {
      name = (QByteArray *)0x3d95fb;
      bVar2 = ::operator==(lhs,(char **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
      if (bVar2) {
        bVar2 = nextToken(this_01);
        if ((bVar2) && (qVar3 = QByteArray::size(in_RDI + 1), qVar3 != 0)) {
          QByteArray::operator=(&local_40,in_RDI + 1);
          goto LAB_0017a4f0;
        }
        bVar4 = false;
      }
      else {
        qVar3 = QByteArray::size(in_RDI + 1);
        if (qVar3 == 0) {
LAB_0017a4f0:
          bVar2 = processDirective((QHstsHeaderParser *)this_00,name,
                                   (QByteArray *)
                                   CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          if (bVar2) {
            bVar4 = nextToken(this_01);
          }
          else {
            bVar4 = false;
          }
        }
        else {
          bVar4 = false;
        }
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x17a539);
  }
  else {
    bVar4 = 0;
  }
  QByteArray::~QByteArray((QByteArray *)0x17a543);
LAB_0017a543:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QHstsHeaderParser::parseDirective()
{
    // RFC 6797, 6.1:
    //
    // directive = directive-name [ "=" directive-value ]
    // directive-name = token
    // directive-value = token | quoted-string


    // RFC 2616, 2.2:
    //
    // token          = 1*<any CHAR except CTLs or separators>

    if (!nextToken())
        return false;

    if (!token.size()) // No more data, but no error.
        return true;

    if (token == ";") // That's a weird grammar, but that's what it is.
        return true;

    if (!isTOKEN(token.at(0))) // Not a valid directive-name.
        return false;

    const QByteArray directiveName = token;
    // 2. Try to read "=" or ";".
    if (!nextToken())
        return false;

    QByteArray directiveValue;
    if (token == ";") // No directive-value
        return processDirective(directiveName, directiveValue);

    if (token == "=") {
        // We expect a directive-value now:
        if (!nextToken() || !token.size())
            return false;
        directiveValue = token;
    } else if (token.size()) {
        // Invalid syntax:
        return false;
    }

    if (!processDirective(directiveName, directiveValue))
        return false;

    // Read either ";", or 'end of header', or some invalid token.
    return nextToken();
}